

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llava.cpp
# Opt level: O1

bool llava_eval_image_embed
               (llama_context *ctx_llama,llava_image_embed *image_embed,int n_batch,int *n_past)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int n_tokens;
  ulong uVar8;
  llava_embd_batch llava_batch;
  bool local_105;
  llava_embd_batch local_e0;
  
  uVar4 = llama_get_model();
  iVar2 = llama_model_n_embd(uVar4);
  uVar1 = image_embed->n_image_pos;
  uVar8 = (ulong)uVar1;
  local_105 = (int)uVar1 < 1;
  if (0 < (int)uVar1) {
    iVar7 = 0;
    lVar5 = 0;
    lVar6 = 0;
    do {
      n_tokens = (int)uVar8 + iVar7;
      if (n_batch <= n_tokens) {
        n_tokens = n_batch;
      }
      llava_embd_batch::llava_embd_batch
                (&local_e0,(float *)((long)image_embed->embed + lVar5),n_tokens,*n_past,0);
      iVar3 = llama_decode(ctx_llama);
      if (iVar3 == 0) {
        *n_past = *n_past + n_tokens;
      }
      else {
        llava_eval_image_embed_cold_1();
      }
      if (local_e0.logits.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.logits.
                        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_e0.logits.
                              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_e0.logits.
                              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_e0.seq_ids.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.seq_ids.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_e0.seq_ids.super__Vector_base<int_*,_std::allocator<int_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e0.seq_ids.super__Vector_base<int_*,_std::allocator<int_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_e0.seq_id_0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.seq_id_0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_e0.seq_id_0.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e0.seq_id_0.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_e0.n_seq_id.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.n_seq_id.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_e0.n_seq_id.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e0.n_seq_id.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_e0.pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_e0.pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_e0.pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_e0.pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (iVar3 != 0) {
        return local_105;
      }
      lVar6 = lVar6 + n_batch;
      uVar8 = (ulong)image_embed->n_image_pos;
      lVar5 = lVar5 + (long)iVar2 * (long)n_batch * 4;
      iVar7 = iVar7 - n_batch;
      local_105 = (long)uVar8 <= lVar6;
    } while (lVar6 < (long)uVar8);
  }
  return local_105;
}

Assistant:

bool llava_eval_image_embed(llama_context * ctx_llama, const struct llava_image_embed * image_embed, int n_batch, int * n_past) {
    int n_embd  = llama_model_n_embd(llama_get_model(ctx_llama));

    for (int i = 0; i < image_embed->n_image_pos; i += n_batch) {
        int n_eval = image_embed->n_image_pos - i;
        if (n_eval > n_batch) {
            n_eval = n_batch;
        }
        float * embd = image_embed->embed+i*n_embd;
        llava_embd_batch llava_batch = llava_embd_batch(embd, n_eval, *n_past, 0);
        if (llama_decode(ctx_llama, llava_batch.batch)) {
            LOG_ERR("%s : failed to eval\n", __func__);
            return false;
        }
        *n_past += n_eval;
    }
    return true;
}